

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O0

void __thiscall NetworkNS::Domain::put_in_primary_box(Domain *this,double *coords,int *pcoeffs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double distz;
  double disty;
  double distx;
  int *pcoeffs_local;
  double *coords_local;
  Domain *this_local;
  
  dVar7 = coords[1];
  dVar1 = this->BoxLow[1];
  dVar2 = this->YBoxLen;
  dVar3 = coords[2];
  dVar4 = this->BoxLow[2];
  dVar5 = this->ZBoxLen;
  dVar6 = round((*coords - (this->XBoxLen * 0.5 + this->BoxLow[0])) * this->iXBoxLen);
  *pcoeffs = (int)dVar6;
  dVar7 = round((dVar7 - (dVar2 * 0.5 + dVar1)) * this->iYBoxLen);
  pcoeffs[1] = (int)dVar7;
  dVar7 = round((dVar3 - (dVar5 * 0.5 + dVar4)) * this->iZBoxLen);
  pcoeffs[2] = (int)dVar7;
  *coords = (double)*pcoeffs * this->XBoxLen + this->BoxLow[0] + *coords;
  coords[1] = (double)pcoeffs[1] * this->YBoxLen + this->BoxLow[1] + coords[1];
  coords[2] = (double)pcoeffs[2] * this->ZBoxLen + this->BoxLow[2] + coords[2];
  return;
}

Assistant:

void Domain::put_in_primary_box(double *coords, int *pcoeffs){
      
      // Calculate the distance from the center of the simulation box.
      double distx = coords[0] - (BoxLow[0] + 0.5*XBoxLen);
      double disty = coords[1] - (BoxLow[1] + 0.5*YBoxLen);
      double distz = coords[2] - (BoxLow[2] + 0.5*ZBoxLen);
      
      // Calculate the periodic continuation coefficients:
      pcoeffs[0] = round(distx * iXBoxLen);
      pcoeffs[1] = round(disty * iYBoxLen);
      pcoeffs[2] = round(distz * iZBoxLen);
      
      coords[0] += (double)pcoeffs[0] * XBoxLen + BoxLow[0];
      coords[1] += (double)pcoeffs[1] * YBoxLen + BoxLow[1];
      coords[2] += (double)pcoeffs[2] * ZBoxLen + BoxLow[2];
      
      return;
   }